

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntlm.c
# Opt level: O1

CURLcode Curl_auth_create_ntlm_type3_message
                   (Curl_easy *data,char *userp,char *passwdp,ntlmdata *ntlm,char **outptr,
                   size_t *outlen)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  CURLcode CVar4;
  CURLcode CVar5;
  uint uVar6;
  char *pcVar7;
  size_t sVar8;
  sbyte sVar9;
  ulong uVar10;
  uchar *results;
  size_t sVar11;
  ulong uVar12;
  long lVar13;
  uchar *plaintext;
  ulong uVar14;
  uchar *keys;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong __n;
  uint ntresplen;
  uchar *local_960;
  Curl_easy *local_958;
  size_t local_950;
  size_t local_948;
  char *local_940;
  uchar *ntlmv2resp;
  char *local_930;
  uchar entropy [8];
  uchar ntlmv2hash [24];
  uchar lmresp [24];
  uchar entropy_1 [8];
  uchar ntresp [24];
  uchar ntlmbuf [1024];
  char host [1025];
  
  ntresplen = 0x18;
  ntlmv2resp = (uchar *)0x0;
  uVar17 = ntlm->flags;
  memset(host,0,0x401);
  pcVar7 = strchr(userp,0x5c);
  if (pcVar7 == (char *)0x0) {
    pcVar7 = strchr(userp,0x2f);
  }
  local_948 = (long)pcVar7 - (long)userp;
  local_930 = pcVar7 + 1;
  if (pcVar7 == (char *)0x0) {
    local_930 = userp;
  }
  local_940 = userp;
  if (pcVar7 == (char *)0x0) {
    local_948 = 0;
    local_940 = "";
  }
  if (local_930 == (char *)0x0) {
    local_950 = 0;
  }
  else {
    local_950 = strlen(local_930);
  }
  iVar3 = Curl_gethostname(host,0x401);
  if (iVar3 == 0) {
    sVar8 = strlen(host);
  }
  else {
    sVar8 = 0;
    Curl_infof(data,"gethostname() failed, continuing without!\n");
  }
  local_958 = data;
  if (ntlm->target_info_len != 0) {
    CVar4 = Curl_rand(data,entropy,8);
    local_960 = ntresp;
    CVar5 = CVar4;
    if ((((CVar4 == CURLE_OK) &&
         (CVar5 = Curl_ntlm_core_mk_nt_hash(data,passwdp,ntlmbuf), CVar5 == CURLE_OK)) &&
        (CVar5 = Curl_ntlm_core_mk_ntlmv2_hash
                           (local_930,local_950,local_940,local_948,ntlmbuf,ntlmv2hash),
        CVar5 == CURLE_OK)) &&
       ((CVar5 = Curl_ntlm_core_mk_lmv2_resp(ntlmv2hash,entropy,ntlm->nonce,lmresp),
        CVar5 == CURLE_OK &&
        (CVar5 = Curl_ntlm_core_mk_ntlmv2_resp(ntlmv2hash,entropy,ntlm,&ntlmv2resp,&ntresplen),
        CVar5 == CURLE_OK)))) {
      bVar2 = true;
      local_960 = ntlmv2resp;
    }
    else {
      bVar2 = false;
      CVar4 = CVar5;
    }
    if (!bVar2) {
      return CVar4;
    }
    goto LAB_0057dc87;
  }
  if ((ntlm->flags & 0x80000) == 0) {
    CVar5 = Curl_ntlm_core_mk_nt_hash(data,passwdp,ntlmbuf);
    if (CVar5 != CURLE_OK) goto LAB_0057dc70;
    local_960 = ntlm->nonce;
    Curl_ntlm_core_lm_resp(ntlmbuf,local_960,ntresp);
    CVar5 = Curl_ntlm_core_mk_lm_hash(data,passwdp,ntlmv2hash);
    if (CVar5 != CURLE_OK) goto LAB_0057dc70;
    keys = ntlmv2hash;
    results = lmresp;
    sVar11 = sVar8;
    plaintext = local_960;
LAB_0057e10a:
    CVar5 = (CURLcode)sVar11;
    Curl_ntlm_core_lm_resp(keys,plaintext,results);
    bVar2 = true;
  }
  else {
    CVar5 = Curl_rand(data,entropy_1,8);
    if (CVar5 == CURLE_OK) {
      lmresp[0] = entropy_1[0];
      lmresp[1] = entropy_1[1];
      lmresp[2] = entropy_1[2];
      lmresp[3] = entropy_1[3];
      lmresp[4] = entropy_1[4];
      lmresp[5] = entropy_1[5];
      lmresp[6] = entropy_1[6];
      lmresp[7] = entropy_1[7];
      lmresp[8] = '\0';
      lmresp[9] = '\0';
      lmresp[10] = '\0';
      lmresp[0xb] = '\0';
      lmresp[0xc] = '\0';
      lmresp[0xd] = '\0';
      lmresp[0xe] = '\0';
      lmresp[0xf] = '\0';
      lmresp[0x10] = '\0';
      lmresp[0x11] = '\0';
      lmresp[0x12] = '\0';
      lmresp[0x13] = '\0';
      lmresp[0x14] = '\0';
      lmresp[0x15] = '\0';
      lmresp[0x16] = '\0';
      lmresp[0x17] = '\0';
      ntlmv2hash._0_8_ = *(undefined8 *)ntlm->nonce;
      ntlmv2hash[8] = entropy_1[0];
      ntlmv2hash[9] = entropy_1[1];
      ntlmv2hash[10] = entropy_1[2];
      ntlmv2hash[0xb] = entropy_1[3];
      ntlmv2hash[0xc] = entropy_1[4];
      ntlmv2hash[0xd] = entropy_1[5];
      ntlmv2hash[0xe] = entropy_1[6];
      ntlmv2hash[0xf] = entropy_1[7];
      CVar5 = Curl_ssl_md5sum(ntlmv2hash,0x10,entropy,0x10);
      if (CVar5 == CURLE_OK) {
        CVar5 = Curl_ntlm_core_mk_nt_hash(local_958,passwdp,ntlmbuf);
      }
      sVar11 = (size_t)CVar5;
      if (CVar5 == CURLE_OK) {
        keys = ntlmbuf;
        plaintext = entropy;
        results = ntresp;
        goto LAB_0057e10a;
      }
    }
LAB_0057dc70:
    bVar2 = false;
  }
  if (!bVar2) {
    return CVar5;
  }
  local_960 = ntresp;
LAB_0057dc87:
  uVar17 = uVar17 & 1;
  sVar9 = (sbyte)uVar17;
  __n = sVar8 << sVar9;
  local_950 = local_950 << sVar9;
  local_948 = local_948 << sVar9;
  uVar6 = ntresplen + 0x58;
  uVar12 = local_948 + uVar6;
  uVar14 = (ulong)(ntresplen >> 8 & 0xff);
  uVar10 = (ulong)((uint)(local_948 >> 8) & 0xff);
  uVar16 = (ulong)((uint)(local_950 >> 8) & 0xff);
  uVar15 = (ulong)((uint)(__n >> 8) & 0xff);
  uVar1 = ntlm->flags;
  uVar6 = curl_msnprintf((char *)ntlmbuf,0x400,
                         "NTLMSSP%c\x03%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c"
                         ,0,0,0,0,0x18,0,0x18,0,0x40,0,0,0,(ulong)(ntresplen & 0xff),uVar14,
                         (ulong)(ntresplen & 0xff),uVar14,0x58,0,0,0,local_948 & 0xff,uVar10,
                         local_948 & 0xff,uVar10,(ulong)uVar6 & 0xff,(ulong)(uVar6 >> 8 & 0xff),0,0,
                         local_950 & 0xff,uVar16,local_950 & 0xff,uVar16,uVar12 & 0xff,
                         (ulong)((uint)(uVar12 >> 8) & 0xff),0,0,__n & 0xff,uVar15,__n & 0xff,uVar15
                         ,uVar12 + local_950 & 0xff,(ulong)((uint)(uVar12 + local_950 >> 8) & 0xff),
                         0,0,0,0,0,0,0,0,0,0,(ulong)(uVar1 & 0xff),(ulong)(uVar1 >> 8 & 0xff),
                         (ulong)(uVar1 >> 0x10 & 0xff),(ulong)(uVar1 >> 0x18));
  sVar8 = local_950;
  uVar12 = (ulong)(int)uVar6;
  if (uVar6 < 1000) {
    *(undefined8 *)(ntlmbuf + uVar12 + 0x10) = lmresp._16_8_;
    *(undefined8 *)(ntlmbuf + uVar12) = lmresp._0_8_;
    *(undefined8 *)(ntlmbuf + uVar12 + 8) = lmresp._8_8_;
    uVar12 = uVar12 + 0x18;
  }
  uVar14 = (ulong)ntresplen;
  if (uVar12 < 0x400 - ntresplen) {
    memcpy(ntlmbuf + uVar12,local_960,uVar14);
    uVar12 = uVar12 + uVar14;
  }
  (*Curl_cfree)(ntlmv2resp);
  if (__n + uVar12 + sVar8 + local_948 < 0x400) {
    if (uVar17 == 0) {
      memcpy(ntlmbuf + uVar12,local_940,local_948);
    }
    else if (local_948 != 0) {
      uVar14 = 0;
      do {
        ntlmbuf[uVar14 * 2 + uVar12] = local_940[uVar14];
        ntlmbuf[uVar14 * 2 + uVar12 + 1] = '\0';
        uVar14 = uVar14 + 1;
      } while (local_948 >> 1 != uVar14);
    }
    lVar13 = uVar12 + local_948;
    if (uVar17 == 0) {
      memcpy(ntlmbuf + lVar13,local_930,sVar8);
    }
    else if (sVar8 != 0) {
      uVar12 = 0;
      do {
        ntlmbuf[uVar12 * 2 + lVar13] = local_930[uVar12];
        ntlmbuf[uVar12 * 2 + lVar13 + 1] = '\0';
        uVar12 = uVar12 + 1;
      } while (sVar8 >> 1 != uVar12);
    }
    lVar13 = lVar13 + sVar8;
    if (uVar17 == 0) {
      memcpy(ntlmbuf + lVar13,host,__n);
    }
    else if (__n != 0) {
      uVar12 = 0;
      do {
        ntlmbuf[uVar12 * 2 + lVar13] = host[uVar12];
        ntlmbuf[uVar12 * 2 + lVar13 + 1] = '\0';
        uVar12 = uVar12 + 1;
      } while (__n >> 1 != uVar12);
    }
    CVar5 = Curl_base64_encode((Curl_easy *)0x0,(char *)ntlmbuf,lVar13 + __n,outptr,outlen);
    (*Curl_cfree)(ntlm->target_info);
    ntlm->target_info = (void *)0x0;
    ntlm->target_info_len = 0;
  }
  else {
    Curl_failf(local_958,"user + domain + host name too big");
    CVar5 = CURLE_OUT_OF_MEMORY;
  }
  return CVar5;
}

Assistant:

CURLcode Curl_auth_create_ntlm_type3_message(struct Curl_easy *data,
                                             const char *userp,
                                             const char *passwdp,
                                             struct ntlmdata *ntlm,
                                             char **outptr, size_t *outlen)

{
  /* NTLM type-3 message structure:

          Index  Description            Content
            0    NTLMSSP Signature      Null-terminated ASCII "NTLMSSP"
                                        (0x4e544c4d53535000)
            8    NTLM Message Type      long (0x03000000)
           12    LM/LMv2 Response       security buffer
           20    NTLM/NTLMv2 Response   security buffer
           28    Target Name            security buffer
           36    User Name              security buffer
           44    Workstation Name       security buffer
          (52)   Session Key            security buffer (*)
          (60)   Flags                  long (*)
          (64)   OS Version Structure   8 bytes (*)
  52 (64) (72)   Start of data block
                                          (*) -> Optional
  */

  CURLcode result = CURLE_OK;
  size_t size;
  unsigned char ntlmbuf[NTLM_BUFSIZE];
  int lmrespoff;
  unsigned char lmresp[24]; /* fixed-size */
#ifdef USE_NTRESPONSES
  int ntrespoff;
  unsigned int ntresplen = 24;
  unsigned char ntresp[24]; /* fixed-size */
  unsigned char *ptr_ntresp = &ntresp[0];
  unsigned char *ntlmv2resp = NULL;
#endif
  bool unicode = (ntlm->flags & NTLMFLAG_NEGOTIATE_UNICODE) ? TRUE : FALSE;
  char host[HOSTNAME_MAX + 1] = "";
  const char *user;
  const char *domain = "";
  size_t hostoff = 0;
  size_t useroff = 0;
  size_t domoff = 0;
  size_t hostlen = 0;
  size_t userlen = 0;
  size_t domlen = 0;

  user = strchr(userp, '\\');
  if(!user)
    user = strchr(userp, '/');

  if(user) {
    domain = userp;
    domlen = (user - domain);
    user++;
  }
  else
    user = userp;

  if(user)
    userlen = strlen(user);

  /* Get the machine's un-qualified host name as NTLM doesn't like the fully
     qualified domain name */
  if(Curl_gethostname(host, sizeof(host))) {
    infof(data, "gethostname() failed, continuing without!\n");
    hostlen = 0;
  }
  else {
    hostlen = strlen(host);
  }

#if defined(USE_NTRESPONSES) && defined(USE_NTLM_V2)
  if(ntlm->target_info_len) {
    unsigned char ntbuffer[0x18];
    unsigned char entropy[8];
    unsigned char ntlmv2hash[0x18];

    result = Curl_rand(data, entropy, 8);
    if(result)
      return result;

    result = Curl_ntlm_core_mk_nt_hash(data, passwdp, ntbuffer);
    if(result)
      return result;

    result = Curl_ntlm_core_mk_ntlmv2_hash(user, userlen, domain, domlen,
                                           ntbuffer, ntlmv2hash);
    if(result)
      return result;

    /* LMv2 response */
    result = Curl_ntlm_core_mk_lmv2_resp(ntlmv2hash, entropy,
                                         &ntlm->nonce[0], lmresp);
    if(result)
      return result;

    /* NTLMv2 response */
    result = Curl_ntlm_core_mk_ntlmv2_resp(ntlmv2hash, entropy,
                                           ntlm, &ntlmv2resp, &ntresplen);
    if(result)
      return result;

    ptr_ntresp = ntlmv2resp;
  }
  else
#endif

#if defined(USE_NTRESPONSES) && defined(USE_NTLM2SESSION)
  /* We don't support NTLM2 if we don't have USE_NTRESPONSES */
  if(ntlm->flags & NTLMFLAG_NEGOTIATE_NTLM2_KEY) {
    unsigned char ntbuffer[0x18];
    unsigned char tmp[0x18];
    unsigned char md5sum[MD5_DIGEST_LENGTH];
    unsigned char entropy[8];

    /* Need to create 8 bytes random data */
    result = Curl_rand(data, entropy, 8);
    if(result)
      return result;

    /* 8 bytes random data as challenge in lmresp */
    memcpy(lmresp, entropy, 8);

    /* Pad with zeros */
    memset(lmresp + 8, 0, 0x10);

    /* Fill tmp with challenge(nonce?) + entropy */
    memcpy(tmp, &ntlm->nonce[0], 8);
    memcpy(tmp + 8, entropy, 8);

    result = Curl_ssl_md5sum(tmp, 16, md5sum, MD5_DIGEST_LENGTH);
    if(!result)
      /* We shall only use the first 8 bytes of md5sum, but the des code in
         Curl_ntlm_core_lm_resp only encrypt the first 8 bytes */
      result = Curl_ntlm_core_mk_nt_hash(data, passwdp, ntbuffer);
    if(result)
      return result;

    Curl_ntlm_core_lm_resp(ntbuffer, md5sum, ntresp);

    /* End of NTLM2 Session code */

  }
  else
#endif
  {

#ifdef USE_NTRESPONSES
    unsigned char ntbuffer[0x18];
#endif
    unsigned char lmbuffer[0x18];

#ifdef USE_NTRESPONSES
    result = Curl_ntlm_core_mk_nt_hash(data, passwdp, ntbuffer);
    if(result)
      return result;

    Curl_ntlm_core_lm_resp(ntbuffer, &ntlm->nonce[0], ntresp);
#endif

    result = Curl_ntlm_core_mk_lm_hash(data, passwdp, lmbuffer);
    if(result)
      return result;

    Curl_ntlm_core_lm_resp(lmbuffer, &ntlm->nonce[0], lmresp);

    /* A safer but less compatible alternative is:
     *   Curl_ntlm_core_lm_resp(ntbuffer, &ntlm->nonce[0], lmresp);
     * See https://davenport.sourceforge.io/ntlm.html#ntlmVersion2 */
  }

  if(unicode) {
    domlen = domlen * 2;
    userlen = userlen * 2;
    hostlen = hostlen * 2;
  }

  lmrespoff = 64; /* size of the message header */
#ifdef USE_NTRESPONSES
  ntrespoff = lmrespoff + 0x18;
  domoff = ntrespoff + ntresplen;
#else
  domoff = lmrespoff + 0x18;
#endif
  useroff = domoff + domlen;
  hostoff = useroff + userlen;

  /* Create the big type-3 message binary blob */
  size = snprintf((char *)ntlmbuf, NTLM_BUFSIZE,
                  NTLMSSP_SIGNATURE "%c"
                  "\x03%c%c%c"  /* 32-bit type = 3 */

                  "%c%c"  /* LanManager length */
                  "%c%c"  /* LanManager allocated space */
                  "%c%c"  /* LanManager offset */
                  "%c%c"  /* 2 zeroes */

                  "%c%c"  /* NT-response length */
                  "%c%c"  /* NT-response allocated space */
                  "%c%c"  /* NT-response offset */
                  "%c%c"  /* 2 zeroes */

                  "%c%c"  /* domain length */
                  "%c%c"  /* domain allocated space */
                  "%c%c"  /* domain name offset */
                  "%c%c"  /* 2 zeroes */

                  "%c%c"  /* user length */
                  "%c%c"  /* user allocated space */
                  "%c%c"  /* user offset */
                  "%c%c"  /* 2 zeroes */

                  "%c%c"  /* host length */
                  "%c%c"  /* host allocated space */
                  "%c%c"  /* host offset */
                  "%c%c"  /* 2 zeroes */

                  "%c%c"  /* session key length (unknown purpose) */
                  "%c%c"  /* session key allocated space (unknown purpose) */
                  "%c%c"  /* session key offset (unknown purpose) */
                  "%c%c"  /* 2 zeroes */

                  "%c%c%c%c",  /* flags */

                  /* domain string */
                  /* user string */
                  /* host string */
                  /* LanManager response */
                  /* NT response */

                  0,                /* zero termination */
                  0, 0, 0,          /* type-3 long, the 24 upper bits */

                  SHORTPAIR(0x18),  /* LanManager response length, twice */
                  SHORTPAIR(0x18),
                  SHORTPAIR(lmrespoff),
                  0x0, 0x0,

#ifdef USE_NTRESPONSES
                  SHORTPAIR(ntresplen),  /* NT-response length, twice */
                  SHORTPAIR(ntresplen),
                  SHORTPAIR(ntrespoff),
                  0x0, 0x0,
#else
                  0x0, 0x0,
                  0x0, 0x0,
                  0x0, 0x0,
                  0x0, 0x0,
#endif
                  SHORTPAIR(domlen),
                  SHORTPAIR(domlen),
                  SHORTPAIR(domoff),
                  0x0, 0x0,

                  SHORTPAIR(userlen),
                  SHORTPAIR(userlen),
                  SHORTPAIR(useroff),
                  0x0, 0x0,

                  SHORTPAIR(hostlen),
                  SHORTPAIR(hostlen),
                  SHORTPAIR(hostoff),
                  0x0, 0x0,

                  0x0, 0x0,
                  0x0, 0x0,
                  0x0, 0x0,
                  0x0, 0x0,

                  LONGQUARTET(ntlm->flags));

  DEBUGASSERT(size == 64);
  DEBUGASSERT(size == (size_t)lmrespoff);

  /* We append the binary hashes */
  if(size < (NTLM_BUFSIZE - 0x18)) {
    memcpy(&ntlmbuf[size], lmresp, 0x18);
    size += 0x18;
  }

  DEBUG_OUT({
    fprintf(stderr, "**** TYPE3 header lmresp=");
    ntlm_print_hex(stderr, (char *)&ntlmbuf[lmrespoff], 0x18);
  });

#ifdef USE_NTRESPONSES
  if(size < (NTLM_BUFSIZE - ntresplen)) {
    DEBUGASSERT(size == (size_t)ntrespoff);
    memcpy(&ntlmbuf[size], ptr_ntresp, ntresplen);
    size += ntresplen;
  }

  DEBUG_OUT({
    fprintf(stderr, "\n   ntresp=");
    ntlm_print_hex(stderr, (char *)&ntlmbuf[ntrespoff], ntresplen);
  });

  free(ntlmv2resp);/* Free the dynamic buffer allocated for NTLMv2 */

#endif

  DEBUG_OUT({
    fprintf(stderr, "\n   flags=0x%02.2x%02.2x%02.2x%02.2x 0x%08.8x ",
            LONGQUARTET(ntlm->flags), ntlm->flags);
    ntlm_print_flags(stderr, ntlm->flags);
    fprintf(stderr, "\n****\n");
  });

  /* Make sure that the domain, user and host strings fit in the
     buffer before we copy them there. */
  if(size + userlen + domlen + hostlen >= NTLM_BUFSIZE) {
    failf(data, "user + domain + host name too big");
    return CURLE_OUT_OF_MEMORY;
  }

  DEBUGASSERT(size == domoff);
  if(unicode)
    unicodecpy(&ntlmbuf[size], domain, domlen / 2);
  else
    memcpy(&ntlmbuf[size], domain, domlen);

  size += domlen;

  DEBUGASSERT(size == useroff);
  if(unicode)
    unicodecpy(&ntlmbuf[size], user, userlen / 2);
  else
    memcpy(&ntlmbuf[size], user, userlen);

  size += userlen;

  DEBUGASSERT(size == hostoff);
  if(unicode)
    unicodecpy(&ntlmbuf[size], host, hostlen / 2);
  else
    memcpy(&ntlmbuf[size], host, hostlen);

  size += hostlen;

  /* Convert domain, user, and host to ASCII but leave the rest as-is */
  result = Curl_convert_to_network(data, (char *)&ntlmbuf[domoff],
                                   size - domoff);
  if(result)
    return CURLE_CONV_FAILED;

  /* Return with binary blob encoded into base64 */
  result = Curl_base64_encode(NULL, (char *)ntlmbuf, size, outptr, outlen);

  Curl_auth_ntlm_cleanup(ntlm);

  return result;
}